

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_4> * tcu::operator/(Matrix<float,_4,_4> *a,Matrix<float,_4,_4> *b)

{
  long lVar1;
  Matrix<float,_4,_4> *res;
  float *in_RDI;
  float *pfVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined4 uVar6;
  
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  *(undefined8 *)(in_RDI + 2) = 0;
  lVar1 = 0;
  lVar3 = 0;
  pfVar2 = in_RDI;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar1 != lVar4) {
        uVar6 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar4) = uVar6;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar3 != 4);
  lVar1 = 0;
  do {
    auVar5 = divps(*(undefined1 (*) [16])((long)(a->m_data).m_data[0].m_data + lVar1),
                   *(undefined1 (*) [16])((long)(b->m_data).m_data[0].m_data + lVar1));
    *(undefined1 (*) [16])((long)in_RDI + lVar1) = auVar5;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  return (Matrix<float,_4,_4> *)in_RDI;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) / b(row, col);
	return res;
}